

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O0

_Bool chck_buffer_read_string_of_type(char **str,size_t *out_len,chck_bits bits,chck_buffer *buf)

{
  _Bool _Var1;
  uintmax_t size;
  char *pcVar2;
  size_t sVar3;
  chck_variant v_00;
  size_t len;
  chck_variant v;
  chck_buffer *buf_local;
  chck_bits bits_local;
  size_t *out_len_local;
  char **str_local;
  
  v._8_8_ = buf;
  if ((buf != (chck_buffer *)0x0) && (str != (char **)0x0)) {
    *str = (char *)0x0;
    if (out_len != (size_t *)0x0) {
      *out_len = 0;
    }
    memset(&len,0,8);
    v.field_0.u32 = bits;
    _Var1 = chck_buffer_read_int(&len,bits,(chck_buffer *)v._8_8_);
    if (((_Var1 ^ 0xffU) & 1) == 0) {
      v_00.bits = v.field_0.u32;
      v_00.field_0.u64 = len;
      v_00._12_4_ = 0;
      size = variant_get_value(v_00);
      if (out_len != (size_t *)0x0) {
        *out_len = size;
      }
      if (size == 0) {
        str_local._7_1_ = true;
      }
      else {
        pcVar2 = (char *)chck_calloc_add_of(size,1);
        *str = pcVar2;
        if (pcVar2 == (char *)0x0) {
          str_local._7_1_ = false;
        }
        else {
          sVar3 = chck_buffer_read(*str,1,size,(chck_buffer *)v._8_8_);
          if (sVar3 == size) {
            str_local._7_1_ = true;
          }
          else {
            free(*str);
            str_local._7_1_ = false;
          }
        }
      }
    }
    else {
      str_local._7_1_ = false;
    }
    return str_local._7_1_;
  }
  __assert_fail("buf && str",
                "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/buffer.c"
                ,0x131,
                "_Bool chck_buffer_read_string_of_type(char **, size_t *, enum chck_bits, struct chck_buffer *)"
               );
}

Assistant:

bool
chck_buffer_read_string_of_type(char **str, size_t *out_len, enum chck_bits bits, struct chck_buffer *buf)
{
   assert(buf && str);
   *str = NULL;

   if (out_len)
      *out_len = 0;

   struct chck_variant v = { .bits = bits };
   if (unlikely(!chck_buffer_read_int(v.b, bits, buf)))
      return false;

   const size_t len = variant_get_value(v);

   if (out_len)
      *out_len = len;

   if (len <= 0)
      return true;

   if (!(*str = chck_calloc_add_of(len, 1)))
      return false;

   if (unlikely(chck_buffer_read(*str, 1, len, buf) != len)) {
      free(*str);
      return false;
   }

   return true;
}